

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall BER_CONTAINER::fromBuffer(BER_CONTAINER *this,uint8_t *buf,size_t max_len)

{
  size_t sVar1;
  uint8_t *ptr;
  size_t max_len_local;
  uint8_t *buf_local;
  BER_CONTAINER *this_local;
  
  if (max_len < 2) {
    this_local._4_4_ = -0xc;
  }
  else if ((uint)*buf == this->_type) {
    sVar1 = decode_ber_length_integer(buf + 1,&this->_length,(int)max_len);
    if (max_len < (long)this->_length + 2U) {
      this_local._4_4_ = -0xb;
    }
    else {
      this_local._4_4_ = ((int)sVar1 + (int)(buf + 1)) - (int)buf;
    }
  }
  else {
    this_local._4_4_ = -0xf;
  }
  return this_local._4_4_;
}

Assistant:

int BER_CONTAINER::fromBuffer(const uint8_t *buf, size_t max_len) {
    // In the base class we are going to double check our type, and decode the length of this structure, then return bytes read
    if(max_len < 2) return SNMP_BUFFER_ERROR_TLV_TOO_SMALL; // Too small for any type

    const uint8_t* ptr = buf;
    if(*ptr != _type){
        SNMP_LOGE("Mismatched type when decoding %d, %d\n", _type, *ptr);
        return SNMP_BUFFER_ERROR_TYPE_MISMATCH;
    }
    ptr++; // type
    ptr += decode_ber_length_integer(ptr, &_length, max_len);
    if((size_t)_length + 2 > max_len){
        // length of object is too big to read in
        return SNMP_BUFFER_ERROR_MAX_LEN_EXCEEDED;
    }

    return ptr - buf;
}